

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
copy_str<char16_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
          (char *begin,char *end,back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (begin != end) {
    uVar3 = (out.container)->size_;
    do {
      cVar2 = *begin;
      uVar1 = uVar3 + 1;
      uVar4 = uVar3;
      uVar3 = uVar1;
      if ((out.container)->capacity_ < uVar1) {
        (**(out.container)->_vptr_buffer)(out.container);
        uVar4 = (out.container)->size_;
        uVar3 = uVar4 + 1;
      }
      begin = begin + 1;
      (out.container)->size_ = uVar3;
      (out.container)->ptr_[uVar4] = (short)cVar2;
    } while (begin != end);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)out.container;
}

Assistant:

FMT_CONSTEXPR auto copy_str(InputIt begin, InputIt end, OutputIt out)
    -> OutputIt {
  while (begin != end) *out++ = static_cast<Char>(*begin++);
  return out;
}